

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O3

wstring * Microsoft::VisualStudio::CppUnitTestFramework::ToString<char>
                    (wstring *__return_storage_ptr__,CharClass<char> *cc)

{
  uint *puVar1;
  long lVar2;
  pointer pRVar3;
  wostream *pwVar4;
  Range<char> *r;
  pointer pRVar5;
  wostringstream os;
  wchar_t local_1a4;
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  undefined4 auStack_c0 [38];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  lVar2 = *(long *)(local_1a0[0] + -0x18);
  std::wios::fill();
  *(undefined4 *)((long)auStack_c0 + lVar2) = 0x30;
  *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  std::wostream::put((wchar_t)(wostream *)local_1a0);
  pRVar5 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar3) {
    do {
      pwVar4 = (wostream *)local_1a0;
      if ((byte)pRVar5->m_start + 1 != (uint)(byte)pRVar5->m_end) {
        pwVar4 = std::wostream::_M_insert<unsigned_long>((ulong)local_1a0);
        local_1a4 = L'-';
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,&local_1a4,1);
      }
      std::wostream::_M_insert<unsigned_long>((ulong)pwVar4);
      local_1a4 = L' ';
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_1a0,&local_1a4,1);
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar3);
  }
  std::wostream::put((wchar_t)local_1a0);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ToString(const Centaurus::CharClass<TCHAR>& cc)
            {
                std::wostringstream os;
                
                os << std::hex << std::setfill(L'0') << std::setw(sizeof(TCHAR) * 2) << std::showbase;
                os.put(L'[');
                for (const auto& r : cc)
                {
                    if (r.start() + 1 == r.end())
                        os << (unsigned int)r.start();
                    else
                        os << (unsigned int)r.start() << L'-' << (unsigned int)r.end() - 1;
                    os << L' ';
                }
                os.put(L']');

                return os.str();
            }